

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O3

bool __thiscall
cplus::utils::Stack<cplus::lang::StringSet::TreeNode_**>::pop
          (Stack<cplus::lang::StringSet::TreeNode_**> *this,TreeNode ***buffer)

{
  cplus_queue_size_t cVar1;
  StackPoint *pSVar2;
  long lVar3;
  
  if (this->lastState != (StackPoint *)0x0) {
    operator_delete(this->lastState);
    this->lastState = (StackPoint *)0x0;
  }
  cVar1 = this->stackSize;
  if (cVar1 != 0) {
    pSVar2 = this->state;
    lVar3 = 0;
    do {
      *(undefined1 *)((long)buffer + lVar3) = *(undefined1 *)((long)&pSVar2->value + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    this->lastState = this->state;
    this->state = this->state->preview;
    this->stackSize = this->stackSize - 1;
  }
  return cVar1 != 0;
}

Assistant:

bool pop(const T &buffer) {
//				std::cout << "Stack: bool pop(const K &buffer)" << std::endl;
				if (lastState != nullptr) {
					delete lastState;
					lastState = nullptr;
				}
				if (stackSize != 0) {
					::cplus::memory::copy(this->state->get(), buffer);
					lastState = this->state;
					this->state = this->state->prev();
					--stackSize;
					return true;
				} else {
					return false;
				}
			}